

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDVertex::GetBoundaryVertexEdges
          (ON_SubDVertex *this,ON_SubDEdgePtr *eptr0,ON_SubDEdgePtr *eptr1)

{
  bool bVar1;
  ON_SubDEdgePtr *pOVar2;
  uint vbi [2];
  undefined8 local_20;
  
  local_20 = 0;
  bVar1 = GetBoundaryVertexEdgeIndices(this,(uint *)&local_20,(uint *)((long)&local_20 + 4));
  if (bVar1) {
    if (eptr0 != (ON_SubDEdgePtr *)0x0) {
      eptr0->m_ptr = this->m_edges[local_20 & 0xffffffff].m_ptr;
    }
    if (eptr1 == (ON_SubDEdgePtr *)0x0) {
      return bVar1;
    }
    pOVar2 = this->m_edges + (local_20 >> 0x20);
  }
  else {
    if (eptr0 != (ON_SubDEdgePtr *)0x0) {
      eptr0->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
    }
    if (eptr1 == (ON_SubDEdgePtr *)0x0) {
      return bVar1;
    }
    pOVar2 = &ON_SubDEdgePtr::Null;
  }
  eptr1->m_ptr = pOVar2->m_ptr;
  return bVar1;
}

Assistant:

bool ON_SubDVertex::GetBoundaryVertexEdges(
  ON_SubDEdgePtr* eptr0,
  ON_SubDEdgePtr* eptr1
) const
{
  unsigned int vbi[2] = {};
  const bool rc = GetBoundaryVertexEdgeIndices(&vbi[0], &vbi[1]);
  if (rc)
  {
    if (nullptr != eptr0)
      *eptr0 = m_edges[vbi[0]];
    if (nullptr != eptr1)
      *eptr1 = m_edges[vbi[1]];
  }
  else
  {
    if (nullptr != eptr0)
      *eptr0 = ON_SubDEdgePtr::Null;
    if (nullptr != eptr1)
      *eptr1 = ON_SubDEdgePtr::Null;
  }
  return rc;
}